

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O1

int LUDecompose(double **a,int n,double *vv,int *indx,double *pd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  double **ppdVar8;
  int iVar9;
  ulong unaff_RBP;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  uVar7 = (ulong)(uint)n;
  if (0 < n) {
    uVar10 = 0;
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    do {
      uVar11 = 0;
      auVar16 = ZEXT816(0) << 0x40;
      do {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = a[uVar10][uVar11];
        auVar17 = vandpd_avx(auVar17,auVar14);
        auVar16 = vmaxsd_avx(auVar17,auVar16);
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
      dVar15 = auVar16._0_8_;
      if ((dVar15 == 0.0) && (!NAN(dVar15))) {
        printf("singular matrix in routine LUDecompose");
        return 1;
      }
      vv[uVar10] = 1.0 / dVar15;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar7);
  }
  if (n < 1) {
    dVar15 = 1.0;
  }
  else {
    uVar11 = 0;
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    dVar15 = 1.0;
    ppdVar8 = a;
    uVar10 = uVar7;
    do {
      if (uVar11 != 0) {
        uVar13 = 0;
        do {
          pdVar3 = a[uVar13];
          dVar18 = pdVar3[uVar11];
          auVar19 = ZEXT864((ulong)dVar18);
          if (uVar13 != 0) {
            uVar12 = 0;
            do {
              auVar20._8_8_ = 0;
              auVar20._0_8_ = pdVar3[uVar12];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = a[uVar12][uVar11];
              auVar14 = vfnmadd231sd_fma(auVar19._0_16_,auVar20,auVar1);
              auVar19 = ZEXT1664(auVar14);
              dVar18 = auVar14._0_8_;
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
          }
          pdVar3[uVar11] = dVar18;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      auVar19 = ZEXT864(0) << 0x40;
      uVar13 = uVar11;
      do {
        pdVar3 = a[uVar13];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = pdVar3[uVar11];
        if (uVar11 != 0) {
          uVar12 = 0;
          do {
            auVar23._8_8_ = 0;
            auVar23._0_8_ = pdVar3[uVar12];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = a[uVar12][uVar11];
            auVar21 = vfnmadd231sd_fma(auVar21,auVar23,auVar2);
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        pdVar3[uVar11] = auVar21._0_8_;
        auVar14 = vandpd_avx(auVar21,auVar16);
        dVar18 = auVar14._0_8_ * vv[uVar13];
        uVar12 = unaff_RBP;
        if (auVar19._0_8_ <= dVar18) {
          uVar12 = uVar13;
        }
        unaff_RBP = uVar12 & 0xffffffff;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar18;
        uVar5 = vcmpsd_avx512f(auVar19._0_16_,auVar22,6);
        bVar6 = (bool)((byte)uVar5 & 1);
        uVar13 = uVar13 + 1;
        auVar19 = ZEXT864((ulong)bVar6 * (long)auVar19._0_8_ + (ulong)!bVar6 * (long)dVar18);
      } while (uVar13 != uVar7);
      iVar9 = (int)uVar12;
      if (uVar11 != (uVar12 & 0xffffffff)) {
        pdVar3 = a[iVar9];
        pdVar4 = a[uVar11];
        uVar13 = 0;
        do {
          dVar18 = pdVar3[uVar13];
          pdVar3[uVar13] = pdVar4[uVar13];
          pdVar4[uVar13] = dVar18;
          uVar13 = uVar13 + 1;
        } while (uVar7 != uVar13);
        dVar15 = -dVar15;
        vv[iVar9] = vv[uVar11];
      }
      indx[uVar11] = iVar9;
      pdVar3 = a[uVar11];
      if ((pdVar3[uVar11] == 0.0) && (!NAN(pdVar3[uVar11]))) {
        pdVar3[uVar11] = 1e-20;
      }
      if ((uVar11 != n - 1) && (uVar11 + 1 < uVar7)) {
        dVar18 = pdVar3[uVar11];
        uVar13 = 1;
        do {
          ppdVar8[uVar13][uVar11] = (1.0 / dVar18) * ppdVar8[uVar13][uVar11];
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      uVar11 = uVar11 + 1;
      ppdVar8 = ppdVar8 + 1;
      uVar10 = uVar10 - 1;
    } while (uVar11 != uVar7);
  }
  if (pd != (double *)0x0) {
    *pd = dVar15;
  }
  return 0;
}

Assistant:

int LUDecompose (double **a, int n, double *vv, int *indx, double *pd)
	/*   **a = the matrix whose LU-decomposition is wanted                    */
	/*     n = order of a                                                     */
	/*   *vv = work vector of size n (stores implicit scaling of each row)    */
	/* *indx => row permutation according to partial pivoting sequence        */
	/*   *pd => 1 if number of row interchanges was even, -1 if odd (NULL OK) */
{
	int			i, imax, j, k;
	double		big, dum, sum, temp, d;

	d = 1.0;
	for (i = 0; i < n; i++)
		{
		big = 0.0;
		for (j = 0; j < n; j++)
			{
			if ((temp = fabs(a[i][j])) > big)
				big = temp;
			}
		if (big == 0.0)
			{
			printf("singular matrix in routine LUDecompose");
			return ERROR;
			}
		vv[i] = ONE_POINT_ZERO / big;
		}
	for (j = 0; j < n; j++)
		{
		for (i = 0; i < j; i++)
			{
			sum = a[i][j];
			for (k = 0; k < i; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			}
		big = 0.0;
		for (i = j; i < n; i++)
			{
			sum = a[i][j];
			for (k = 0; k < j; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			dum = vv[i] * fabs(sum);
			if (dum >= big)
				{
				big = dum;
				imax = i;
				}
			}
		if (j != imax)
			{
			for (k = 0; k < n; k++)
				{
				dum = a[imax][k];
				a[imax][k] = a[j][k];
				a[j][k] = dum;
				}	
			d = -d;
			vv[imax] = vv[j];
			}
		indx[j] = imax;
		if (a[j][j] == 0.0)
			a[j][j] = TINY;
		if (j != n - 1)
			{
			dum = ONE_POINT_ZERO / (a[j][j]);
			for (i = j + 1; i < n; i++)
				a[i][j] *= dum;
			}
		}

	if (pd != NULL)
		*pd = d;
	return NO_ERROR;
}